

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

_Bool square_trap_specific(chunk *c,loc grid,wchar_t t_idx)

{
  _Bool _Var1;
  trap *ptVar2;
  
  ptVar2 = square_trap((chunk_conflict *)c,grid);
  _Var1 = square_istrap((chunk_conflict *)c,grid);
  if (ptVar2 == (trap *)0x0 || !_Var1) {
    _Var1 = false;
  }
  else {
    do {
      _Var1 = (uint)ptVar2->t_idx == t_idx;
      if (_Var1) {
        return _Var1;
      }
      ptVar2 = ptVar2->next;
    } while (ptVar2 != (trap *)0x0);
  }
  return _Var1;
}

Assistant:

bool square_trap_specific(struct chunk *c, struct loc grid, int t_idx)
{
    struct trap *trap = square_trap(c, grid);
	
    /* First, check the trap marker */
    if (!square_istrap(c, grid))
		return false;
	
    /* Scan the square trap list */
    while (trap) {
		/* We found a trap of the right kind */
		if (trap->t_idx == t_idx)
			return true;
		trap = trap->next;
	}

    /* Report failure */
    return false;
}